

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

prsndef * prsfold(prscxdef *ctx,prsndef *node)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  prsndef *ppVar6;
  int *piVar7;
  prsndef *ppVar8;
  ulong uVar9;
  int iVar10;
  uint siz;
  byte bVar11;
  int iVar12;
  long lVar13;
  byte *pbVar14;
  bool bVar15;
  tokdef t;
  tokdef local_a0;
  
  if (node->prsntyp == 0x3b) {
    bVar15 = true;
    siz = 8;
    iVar12 = 0;
    ppVar8 = node;
    do {
      ppVar6 = prsfold(ctx,(ppVar8->prsnv).prsnvn[0]);
      (ppVar8->prsnv).prsnvn[0] = ppVar6;
      iVar10 = 0x39;
      bVar4 = false;
      if (ppVar6->prsnnlf == 0) {
        iVar10 = (ppVar6->prsnv).prsnvt.toktyp;
        if ((0x1f < iVar10 - 0x36U) ||
           (bVar4 = bVar15, (0x81c00007U >> (iVar10 - 0x36U & 0x1f) & 1) == 0)) {
          bVar4 = false;
        }
      }
      bVar15 = bVar4;
      if ((iVar10 == 0x38) && (((ppVar6->prsnv).prsnvt.toksym.tokstyp & 0xfe) == 4)) {
        bVar15 = false;
      }
      if (ppVar6->prsnnlf == 0 && iVar10 == 0x38) {
        prsdef(ctx,&(ppVar6->prsnv).prsnvt,7);
      }
      iVar12 = iVar12 + 1;
      ppVar8 = (ppVar8->prsnv).prsnvn[1];
      siz = siz + 0x10;
    } while (ppVar8 != (prsndef *)0x0);
    if (!bVar15) {
      return node;
    }
    piVar7 = (int *)prsbalo(ctx,siz);
    local_a0.toktyp = 0x4c;
    local_a0.tokofs = ((short)piVar7 - (short)ctx) - 0xd0;
    ppVar8 = prsnew0(ctx,&local_a0);
    *piVar7 = iVar12;
    pbVar14 = (byte *)(piVar7 + 2);
    do {
      ppVar6 = (node->prsnv).prsnvn[0];
      bVar11 = *(byte *)&ppVar6->prsnv;
      *pbVar14 = bVar11;
      if (bVar11 < 0x4c) {
        if (bVar11 == 0x36) {
LAB_0011f051:
          uVar9 = (ulong)(ppVar6->prsnv).prsnvt.tokofs;
        }
        else {
          if (bVar11 != 0x38) goto LAB_0011f057;
          bVar11 = (ppVar6->prsnv).prsnvt.toksym.tokstyp - 1;
          if ((0xd < bVar11) || ((0x20c7U >> (bVar11 & 0x1f) & 1) == 0)) {
            errsigf(ctx->prscxerr,"TADS",0x193);
          }
          *pbVar14 = (&DAT_0013a386)[bVar11];
          uVar9 = (ulong)*(ushort *)((long)&ppVar6->prsnv + 0x42);
        }
      }
      else {
        if ((bVar11 == 0x55) || (bVar11 == 0x4c)) goto LAB_0011f051;
LAB_0011f057:
        uVar9 = (ppVar6->prsnv).prsnvt.tokval;
      }
      *(ulong *)(pbVar14 + 8) = uVar9;
      node = (node->prsnv).prsnvn[1];
      pbVar14 = pbVar14 + 0x10;
      if (node == (prsndef *)0x0) {
        return ppVar8;
      }
    } while( true );
  }
  iVar12 = node->prsnnlf;
  if (iVar12 == 0) {
    bVar11 = 1;
  }
  else {
    bVar11 = 1;
    lVar13 = 0;
    do {
      ppVar8 = prsfold(ctx,*(prsndef **)((long)&node->prsnv + lVar13 * 8));
      *(prsndef **)((long)&node->prsnv + lVar13 * 8) = ppVar8;
      if (((ppVar8->prsnnlf != 0) || (uVar5 = (ppVar8->prsnv).prsnvt.toktyp - 0x36, 0x1f < uVar5))
         || ((0x81c00003U >> (uVar5 & 0x1f) & 1) == 0)) {
        bVar11 = 0;
      }
      lVar13 = lVar13 + 1;
    } while (iVar12 != (int)lVar13);
  }
  iVar12 = node->prsnnlf;
  if (!(bool)(iVar12 != 0 & bVar11)) {
    return node;
  }
  if (iVar12 == 3) {
    iVar12 = ((node->prsnv).prsnvn[0]->prsnv).prsnvt.toktyp;
    if (1 < iVar12 - 0x4dU) {
      if (iVar12 != 0x37) goto LAB_0011f361;
      iVar12 = 0x4e - (uint)(((node->prsnv).prsnvn[0]->prsnv).prsnvt.tokval == 0);
    }
    if (iVar12 != 0x4e) {
      return (node->prsnv).prsnvn[2];
    }
    return (prsndef *)(node->prsnv).prsnvt.tokval;
  }
  if (iVar12 != 2) {
    if (iVar12 != 1) {
      return node;
    }
    ppVar8 = (node->prsnv).prsnvn[0];
    iVar12 = (ppVar8->prsnv).prsnvt.toktyp;
    uVar9 = (ppVar8->prsnv).prsnvt.tokval;
    iVar10 = node->prsntyp;
    if (iVar10 < 6) {
      if (iVar10 == 2) goto LAB_0011f344;
      if (iVar10 != 3) {
        return node;
      }
      if (iVar12 != 0x37) goto LAB_0011f361;
      uVar9 = -uVar9;
    }
    else {
      if (iVar10 == 6) {
        if (iVar12 - 0x4dU < 2) {
          bVar15 = iVar12 == 0x4d;
        }
        else {
          if (iVar12 != 0x37) goto LAB_0011f361;
          bVar15 = uVar9 == 0;
        }
        (ppVar8->prsnv).prsnvt.toktyp = bVar15 + 0x4d;
        goto LAB_0011f344;
      }
      if (iVar10 != 0x1e) {
        return node;
      }
      if (iVar12 != 0x37) goto LAB_0011f361;
      uVar9 = ~uVar9;
    }
    (ppVar8->prsnv).prsnvt.tokval = uVar9;
    goto LAB_0011f344;
  }
  ppVar8 = (node->prsnv).prsnvn[0];
  uVar9 = (ppVar8->prsnv).prsnvt.tokval;
  uVar2 = ((node->prsnv).prsnvn[1]->prsnv).prsnvt.tokval;
  iVar12 = (ppVar8->prsnv).prsnvt.toktyp;
  iVar10 = ((node->prsnv).prsnvn[1]->prsnv).prsnvt.toktyp;
  iVar1 = node->prsntyp;
  switch(iVar1 + -2) {
  case 0:
  case 1:
    break;
  case 2:
  case 3:
  case 0xb:
  case 0xf:
  case 0x10:
    goto switchD_0011f10f_caseD_2;
  case 4:
  case 0xc:
  case 0xd:
    goto LAB_0011f26f;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
    goto switchD_0011f10f_caseD_5;
  case 0xe:
    goto switchD_0011f10f_caseD_e;
  default:
    if (1 < iVar1 - 0x41U) {
      return node;
    }
    if (((1 < iVar12 - 0x4dU) && (iVar12 != 0x37)) || ((1 < iVar10 - 0x4dU && (iVar10 != 0x37))))
    goto LAB_0011f361;
    iVar3 = 0x4e - (uint)(uVar9 == 0);
    if (iVar12 != 0x37) {
      iVar3 = iVar12;
    }
    iVar12 = 0x4e - (uint)(uVar2 == 0);
    if (iVar10 != 0x37) {
      iVar12 = iVar10;
    }
    if (iVar1 == 0x42) {
      bVar15 = iVar3 == 0x4e && iVar12 == 0x4e;
    }
    else {
      bVar15 = iVar3 == 0x4e || iVar12 == 0x4e;
    }
    goto LAB_0011f2ac;
  }
  if (iVar10 == 0x4c) {
    return node;
  }
  if (iVar12 == 0x36) {
    return node;
  }
  if (iVar12 == 0x4c) {
    return node;
  }
switchD_0011f10f_caseD_5:
  if ((iVar12 != 0x37) || (iVar10 != 0x37)) {
LAB_0011f26f:
    return node;
  }
switchD_0011f10f_caseD_e:
  if ((iVar10 - 0x4dU | iVar12 - 0x4dU) < 2) {
    bVar15 = (iVar10 == 0x4e) != (iVar12 == 0x4e);
LAB_0011f2ac:
    (ppVar8->prsnv).prsnvt.toktyp = bVar15 + 0x4d;
    goto LAB_0011f344;
  }
switchD_0011f10f_caseD_2:
  if ((iVar12 != 0x37) || (iVar10 != 0x37)) {
LAB_0011f361:
    errsigf(ctx->prscxerr,"TADS",0x143);
  }
  switch(iVar1 + -2) {
  case 0:
    uVar9 = uVar9 + uVar2;
    break;
  case 1:
    uVar9 = uVar9 - uVar2;
    break;
  case 2:
    if (uVar2 == 0) {
LAB_0011f375:
      errsigf(ctx->prscxerr,"TADS",0x414);
    }
    uVar9 = (long)uVar9 / (long)uVar2;
    break;
  case 3:
    uVar9 = uVar9 * uVar2;
    break;
  default:
    goto LAB_0011f26f;
  case 5:
    uVar5 = (uint)(uVar9 == uVar2);
    goto LAB_0011f33a;
  case 6:
    uVar5 = (uint)(uVar9 != uVar2);
    goto LAB_0011f33a;
  case 7:
    uVar5 = (uint)((long)uVar2 < (long)uVar9);
    goto LAB_0011f33a;
  case 8:
    uVar5 = (uint)((long)uVar2 <= (long)uVar9);
    goto LAB_0011f33a;
  case 9:
    uVar5 = (uint)((long)uVar9 < (long)uVar2);
    goto LAB_0011f33a;
  case 10:
    uVar5 = (uint)((long)uVar9 <= (long)uVar2);
LAB_0011f33a:
    iVar12 = uVar5 + 0x4d;
    goto LAB_0011f33d;
  case 0xb:
    if (uVar2 == 0) goto LAB_0011f375;
    uVar9 = (long)uVar9 % (long)uVar2;
    iVar12 = 0x37;
    goto LAB_0011f33d;
  case 0xe:
    uVar9 = uVar9 ^ uVar2;
    break;
  case 0xf:
    uVar9 = uVar9 << ((byte)uVar2 & 0x3f);
    break;
  case 0x10:
    uVar9 = (long)uVar9 >> ((byte)uVar2 & 0x3f);
  }
  iVar12 = 0x37;
LAB_0011f33d:
  (ppVar8->prsnv).prsnvt.toktyp = iVar12;
  (ppVar8->prsnv).prsnvt.tokval = uVar9;
LAB_0011f344:
  return (node->prsnv).prsnvn[0];
}

Assistant:

static prsndef *prsfold(prscxdef *ctx, prsndef *node)
{
    int       i;
    prsndef **n;
    int       can_fold;
    int       typ;
    tokdef   *tok1, *tok2;
    int       typ1, typ2;
    long      val1, val2;
    prsndef  *ncur;
    
    can_fold = TRUE;                       /* assume we can do some folding */

    /* if this is a list-construction node, special handling is needed */
    if (node->prsntyp == TOKTRBRACK)
    {
        for (i=0, ncur = node ; ncur ; ++i, ncur = ncur->prsnv.prsnvn[1])
        {
            ncur->prsnv.prsnvn[0] = prsfold(ctx, ncur->prsnv.prsnvn[0]);
            typ = TOKTINVALID;
            if (ncur->prsnv.prsnvn[0]->prsnnlf != 0 ||
                ((typ = ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toktyp)
                 != TOKTNUMBER && typ != TOKTSSTRING && typ != TOKTLIST
                 && typ != TOKTNIL && typ != TOKTTRUE && typ != TOKTPOUND
                 && typ != TOKTSYMBOL))
                can_fold = FALSE;              /* not constant - can't fold */
            
            if (typ == TOKTSYMBOL
                && (ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toksym.tokstyp
                    == TOKSTLOCAL
                    || ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toksym.tokstyp
                    == TOKSTSELF))
                can_fold = FALSE;
            
            if (ncur->prsnv.prsnvn[0]->prsnnlf == 0 && typ == TOKTSYMBOL)
                prsdef(ctx, &ncur->prsnv.prsnvn[0]->prsnv.prsnvt,
                       TOKSTFWDOBJ);
        }
        if (can_fold)
        {
            tokdef    t;
            emtlidef *lst;
            prsndef  *retval;
            emtledef *ele;
            
            lst = (emtlidef *)prsbalo(ctx, (uint)(sizeof(emtlidef) +
                                                 (i - 1) * sizeof(emtledef)));
            t.toktyp = TOKTLIST;
            t.tokofs = ((uchar *)lst) - &ctx->prscxpool[0];
            retval = prsnew0(ctx, &t);
            
            lst->emtlicnt = i;
            
            for (ele = &lst->emtliele[0] ; node ;
                   node = node->prsnv.prsnvn[1], ++ele)
            {
                ncur = node->prsnv.prsnvn[0];
                switch(ele->emtletyp = ncur->prsnv.prsnvt.toktyp)
                {
                case TOKTLIST:
                case TOKTSSTRING:
                case TOKTPOUND:
                    ele->emtleval = ncur->prsnv.prsnvt.tokofs;
                    break;
                    
                case TOKTSYMBOL:
                    switch(ncur->prsnv.prsnvt.toksym.tokstyp)
                    {
                    case TOKSTFUNC:
                    case TOKSTFWDFN:
                        ele->emtletyp = TOKTFUNCTION;
                        break;
                    case TOKSTOBJ:
                    case TOKSTFWDOBJ:
                        ele->emtletyp = TOKTOBJECT;
                        break;
                    case TOKSTPROP:
                        ele->emtletyp = TOKTDOT;
                        break;
                    case TOKSTPROPSPEC:
                        ele->emtletyp = TOKTDOT;
                        break;
                    default:
                        errsig(ctx->prscxerr, ERR_INVLSTE);
                    }
                    ele->emtleval = ncur->prsnv.prsnvt.toksym.toksval;
                    break;
                    
                default:
                    ele->emtleval = ncur->prsnv.prsnvt.tokval;
                    break;
                }
            }

            node = retval;
        }
        return(node);
    }
    
    /*
     *   If we have sub-nodes, try to fold them.  If they fold down to
     *   leaf nodes, we can try to apply the expression to them. 
     */
    for (i = node->prsnnlf, n = &node->prsnv.prsnvn[0] ; i ; ++n, --i)
    {
        *n = prsfold(ctx, *n);
        if ((*n)->prsnnlf != 0 ||
            ((typ = (*n)->prsnv.prsnvt.toktyp) != TOKTNUMBER &&
             typ != TOKTSSTRING && typ != TOKTLIST &&
             typ != TOKTNIL && typ != TOKTTRUE && typ != TOKTPOUND))
            can_fold = FALSE;                  /* not constant - can't fold */
    }

    /* if at a leaf, or subnodes are non-constant, can't fold anything */
    if (node->prsnnlf == 0 || !can_fold) return(node);

    switch(node->prsnnlf)
    {
    case 1:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        typ1 = tok1->toktyp;
        val1 = tok1->tokval;
        
        switch(node->prsntyp)
        {
        case TOKTPLUS:
            break;
            
        case TOKTMINUS:
            if (typ1 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->tokval = -val1;
            break;
            
        case TOKTNOT:
            if (!prsvlog(typ1))
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->toktyp = (prs2log(typ1, val1) == TOKTNIL ?
                            TOKTTRUE : TOKTNIL);
            break;

        case TOKTTILDE:
            if (typ1 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->tokval = ~val1;
            break;
            
        default:
            return(node);
        }
        break;
        
    case 2:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        tok2 = &node->prsnv.prsnvn[1]->prsnv.prsnvt;
        val1 = tok1->tokval;
        val2 = tok2->tokval;
        typ1 = tok1->toktyp;
        typ2 = tok2->toktyp;
        
        switch(node->prsntyp)
        {
        case TOKTOR:
        case TOKTAND:
            if (!prsvlog(typ1) || !prsvlog(typ2))
                errsig(ctx->prscxerr, ERR_INVOP);
            typ1 = (prs2log(typ1, val1) == TOKTTRUE);
            typ2 = (prs2log(typ2, val2) == TOKTTRUE);

            if (node->prsntyp == TOKTAND) typ1 = typ1 && typ2;
            else                          typ1 = typ1 || typ2;

            tok1->toktyp = (typ1 ? TOKTTRUE : TOKTNIL);
            break;

        case TOKTPLUS:
        case TOKTMINUS:
            if (typ1 == TOKTSSTRING || typ1 == TOKTLIST || typ2 == TOKTLIST)
                return(node);
            /* FALLTHROUGH */
            
        case TOKTEQ:
        case TOKTNE:
        case TOKTGT:
        case TOKTGE:
        case TOKTLT:
        case TOKTLE:
            if (typ1 != TOKTNUMBER || typ2 != TOKTNUMBER)
                return(node);
            /* FALLTHROUGH */

        case TOKTXOR:
            if ((typ1 == TOKTTRUE || typ1 == TOKTNIL)
                && (typ2 == TOKTTRUE || typ2 == TOKTNIL))
            {
                int a, b;

                a = (typ1 == TOKTTRUE ? 1 : 0);
                b = (typ2 == TOKTTRUE ? 1 : 0);
                tok1->toktyp = ((a ^ b) ? TOKTTRUE : TOKTNIL);
                break;
            }
            /* FALLTHROUGH */

        case TOKTDIV:
        case TOKTTIMES:
        case TOKTMOD:
        case TOKTSHL:
        case TOKTSHR:
            if (typ1 != TOKTNUMBER || typ2 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            switch(node->prsntyp)
            {
            case TOKTPLUS:
                val1 += val2;
                break;
            case TOKTMINUS:
                val1 -= val2;
                break;
            case TOKTTIMES:
                val1 *= val2;
                break;
            case TOKTDIV:
                if (val2 == 0)
                    errsig(ctx->prscxerr, ERR_DIVZERO);
                val1 /= val2;
                break;
            case TOKTMOD:
                if (val2 == 0)
                    errsig(ctx->prscxerr, ERR_DIVZERO);
                val1 %= val2;
                break;
            case TOKTXOR:
                val1 ^= val2;
                break;
            case TOKTSHL:
                val1 <<= val2;
                break;
            case TOKTSHR:
                val1 >>= val2;
                break;
            case TOKTEQ:
                typ1 = (val1 == val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTNE:
                typ1 = (val1 != val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTGT:
                typ1 = (val1 > val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTLT:
                typ1 = (val1 < val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTLE:
                typ1 = (val1 <= val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTGE:
                typ1 = (val1 >= val2 ? TOKTTRUE : TOKTNIL);
                break;
                
            default:
                return(node);
            }
            tok1->toktyp = typ1;
            tok1->tokval = val1;
            break;
            
        default:
            return(node);
        }
        break;
        
    case 3:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        if (!prsvlog(tok1->toktyp)) errsig(ctx->prscxerr, ERR_INVOP);
        if (prs2log(tok1->toktyp, tok1->tokval) == TOKTTRUE)
            return(node->prsnv.prsnvn[1]);
        else
            return(node->prsnv.prsnvn[2]);
        
    default:
        return(node);
    }

    /* return the first sub-node, which has the folded value */
    return(node->prsnv.prsnvn[0]);
}